

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_NewFrame(void)

{
  ImGui_ImplOpenGL3_Data *pIVar1;
  ImGui_ImplOpenGL3_Data *bd;
  
  pIVar1 = ImGui_ImplOpenGL3_GetBackendData();
  if (pIVar1->ShaderHandle == 0) {
    ImGui_ImplOpenGL3_CreateDeviceObjects();
  }
  if (pIVar1->FontTexture == 0) {
    ImGui_ImplOpenGL3_CreateFontsTexture();
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_NewFrame()
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplOpenGL3_Init()?");

    if (!bd->ShaderHandle)
        ImGui_ImplOpenGL3_CreateDeviceObjects();
    if (!bd->FontTexture)
        ImGui_ImplOpenGL3_CreateFontsTexture();
}